

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O1

ptls_fusion_aesgcm_context_t *
ptls_fusion_aesgcm_set_capacity(ptls_fusion_aesgcm_context_t *ctx,size_t capacity)

{
  ulong uVar1;
  
  uVar1 = (capacity + 0xf >> 4) + 2;
  if (ctx->ghash_cnt < uVar1) {
    ctx = (ptls_fusion_aesgcm_context_t *)realloc(ctx,uVar1 * 0x20 + 0x110);
    if (ctx == (ptls_fusion_aesgcm_context_t *)0x0) {
      ctx = (ptls_fusion_aesgcm_context_t *)0x0;
    }
    else {
      ctx->capacity = capacity;
      while (uVar1 < ctx->ghash_cnt) {
        setup_one_ghash_entry(ctx);
      }
    }
  }
  return ctx;
}

Assistant:

ptls_fusion_aesgcm_context_t *ptls_fusion_aesgcm_set_capacity(ptls_fusion_aesgcm_context_t *ctx, size_t capacity)
{
    size_t ghash_cnt = aesgcm_calc_ghash_cnt(capacity);

    if (ghash_cnt <= ctx->ghash_cnt)
        return ctx;

    if ((ctx = realloc(ctx, sizeof(*ctx) + sizeof(ctx->ghash[0]) * ghash_cnt)) == NULL)
        return NULL;

    ctx->capacity = capacity;
    while (ghash_cnt < ctx->ghash_cnt)
        setup_one_ghash_entry(ctx);

    return ctx;
}